

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
::DoCvtWithExprs(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
                 *this)

{
  anon_class_16_3_c11e61a9 fn;
  bool bVar1;
  ExpressionAcceptanceLevel EVar2;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
  *in_RDI;
  ExpressionAcceptanceLevel eal;
  ConstraintAcceptanceLevel cal;
  BasicFlatConverter *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ConstraintAcceptanceLevel CVar3;
  BasicConstraintKeeper *in_stack_ffffffffffffffe0;
  
  GetConverter(in_RDI);
  bVar1 = IfConverterConverts((ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8);
  if (bVar1) {
    CVar3 = BasicConstraintKeeper::GetChosenAcceptanceLevel(in_stack_ffffffffffffffe0);
  }
  else {
    CVar3 = Recommended;
  }
  EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(in_stack_ffffffffffffffe0);
  fn.this._4_4_ = EVar2;
  fn.this._0_4_ = CVar3;
  fn.cal = EVar2;
  fn.eal = CVar3;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
  ::
  ForEachActive<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>::DoCvtWithExprs()::_lambda(auto:1_const&,int)_1_>
            (in_RDI,fn);
  return;
}

Assistant:

void DoCvtWithExprs() {
    // For acc:_all=0 to work, we have to accept non-convertible con types
    auto cal = IfConverterConverts(GetConverter())
                   ? GetChosenAcceptanceLevel()
                   : ConstraintAcceptanceLevel::Recommended;
    auto eal = GetChosenAcceptanceLevelEXPR();
    ForEachActive(
        [this, cal, eal](const auto& con, int i) {
          return this->GetConverter().ConvertWithExpressions(con, i, cal, eal);
        });
  }